

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<nonstd::expected_lite::expected<int,char>const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<nonstd::expected_lite::expected<int,char>const&> *this,
          unexpected_type<char> *rhs)

{
  lest lVar1;
  lest lVar2;
  lest lVar3;
  lest *this_00;
  unexpected_type<char> *in_R8;
  allocator local_d9;
  storage_t_impl<int,_char> local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  string local_b8;
  storage_t_impl<int,_char> local_98;
  undefined8 local_90;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  char *local_78;
  size_type local_70;
  char local_68 [8];
  undefined8 uStack_60;
  undefined1 local_58 [40];
  
  this_00 = *(lest **)this;
  lVar1 = this_00[4];
  lVar2 = (lest)rhs->m_error;
  lVar3 = *this_00;
  std::__cxx11::string::string((string *)&local_d8,"==",&local_d9);
  local_98 = (storage_t_impl<int,_char>)local_88;
  if (local_d8 == (storage_t_impl<int,_char>)local_c8) {
    uStack_80 = uStack_c0;
  }
  else {
    local_98 = local_d8;
  }
  local_90 = local_d0;
  local_d0 = 0;
  local_c8[0] = 0;
  local_d8 = (storage_t_impl<int,_char>)local_c8;
  to_string<nonstd::expected_lite::expected<int,char>,nonstd::expected_lite::unexpected_type<char>>
            (&local_b8,this_00,(expected<int,_char> *)&local_98,(string *)rhs,in_R8);
  local_70 = local_b8._M_string_length;
  local_58[0] = (bool)(~(byte)lVar1 & lVar3 == lVar2);
  local_78 = local_68;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
    uStack_60 = local_b8.field_2._8_8_;
  }
  else {
    local_78 = local_b8._M_dataplus._M_p;
  }
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_78);
  result::result(__return_storage_ptr__,(result *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  return __return_storage_ptr__;
}

Assistant:

result operator==( R const & rhs ) { return result{ lhs == rhs, to_string( lhs, "==", rhs ) }; }